

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_get_current_working_dir(void)

{
  char *pcVar1;
  int *piVar2;
  mcu8str *in_RDI;
  char buf [4096];
  mcu8str *str;
  mcu8str_size_t in_stack_ffffffffffffeff8;
  mcu8str *in_stack_fffffffffffff000;
  
  str = in_RDI;
  mcu8str_create_from_staticbuffer((char *)in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  while (pcVar1 = getcwd(in_RDI->c_str,(ulong)in_RDI->buflen), pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x22) && (in_RDI->buflen < 2000000)) {
      mcu8str_clear(in_RDI);
      mcu8str_reserve(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
    }
    else {
      mcu8str_dealloc(str);
      mctools_impl_error((char *)0x1034ad);
    }
  }
  mcu8str_update_size(str);
  mcu8str_ensure_dynamic_buffer(in_stack_fffffffffffff000);
  mctools_pathseps_platform(str);
  return str;
}

Assistant:

mcu8str mctools_get_current_working_dir(void)
  {
#ifdef MC_IS_WINDOWS
    mcwinstr wpath = mc_winstr_create( 4096 );
    DWORD nsize = GetCurrentDirectoryW((DWORD)wpath.buflen, wpath.c_str);
    if ( (mcu8str_size_t)(nsize + 1) > wpath.buflen ) {
      //Use larger buffer and try again:
      mc_winstr_dealloc( &wpath );
      wpath = mc_winstr_create( nsize );
      nsize = GetCurrentDirectoryW((DWORD)wpath.buflen,wpath.c_str);
    }
    if ( nsize == 0 || (mcu8str_size_t )( nsize + 1 ) > wpath.buflen ) {
      mc_winstr_dealloc( &wpath );
      mctools_impl_error("Failed to get current working directory");
      //return mcu8str_create_empty();
    }
    wpath.c_str[nsize] = 0;
    wpath.size = nsize;
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &wpath );
    mc_winstr_dealloc( &wpath );
    mcu8str res = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    mctools_pathseps_platform( &res );
    return res;
#else
    char buf[4096];//almost always enough in first go
    mcu8str res = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    while ( 1 ) {
      if ( getcwd( res.c_str, res.buflen ) ) {
        mcu8str_update_size( &res );
        mcu8str_ensure_dynamic_buffer(&res);//don't return local static buffer
        mctools_pathseps_platform( &res );
        return res;
      }
      if ( errno == ERANGE && res.buflen < 2000000 ) {
        //Try again with larger buffer:
        mcu8str_clear( &res );
        mcu8str_reserve( &res, (res.buflen-1) * 2 );
      } else {
        mcu8str_dealloc( &res );
        mctools_impl_error("Failed to get current working directory");
        //return mcu8str_create_empty();
      }
    }
#endif
  }